

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
format::format_details::generic_format_value<std::__cxx11::string>::operator()
          (generic_format_value<std::__cxx11::string> *this,unsigned_long_long *value)

{
  append_value<std::__cxx11::string,unsigned_long_long>
            (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this,value);
  return;
}

Assistant:

void operator()(T&& value) {
        format::append_value(output, std::forward<T>(value));
      }